

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall
google::protobuf::FileDescriptorTables::FindParentForFieldsByMap
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *in_RSI;
  undefined8 local_8;
  
  bVar1 = FieldDescriptor::is_extension(in_RSI);
  if (bVar1) {
    pDVar2 = FieldDescriptor::extension_scope(in_RSI);
    if (pDVar2 == (Descriptor *)0x0) {
      local_8 = (Descriptor *)FieldDescriptor::file(in_RSI);
    }
    else {
      local_8 = FieldDescriptor::extension_scope(in_RSI);
    }
  }
  else {
    local_8 = FieldDescriptor::containing_type(in_RSI);
  }
  return (FileDescriptor *)local_8;
}

Assistant:

const void* FileDescriptorTables::FindParentForFieldsByMap(
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return field->file();
    } else {
      return field->extension_scope();
    }
  } else {
    return field->containing_type();
  }
}